

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

int newhp(void)

{
  schar sVar1;
  int iVar2;
  int local_18;
  int local_14;
  int local_10;
  int conplus;
  int hp;
  
  if (u.ulevel == 0) {
    local_10 = (int)urole.hpadv.infix + (int)urace.hpadv.infix;
    if ('\0' < urole.hpadv.inrnd) {
      iVar2 = rnd((int)urole.hpadv.inrnd);
      local_10 = iVar2 + local_10;
    }
    if ('\0' < urace.hpadv.inrnd) {
      iVar2 = rnd((int)urace.hpadv.inrnd);
      local_10 = iVar2 + local_10;
    }
    u.ualign.type = aligns[u.initalign].value;
    u.ualign.record = (int)urole.initrecord;
    conplus = local_10;
  }
  else {
    if (u.ulevel < urole.xlev) {
      local_10 = (int)urole.hpadv.lofix + (int)urace.hpadv.lofix;
      if ('\0' < urole.hpadv.lornd) {
        iVar2 = rnd((int)urole.hpadv.lornd);
        local_10 = iVar2 + local_10;
      }
      if ('\0' < urace.hpadv.lornd) {
        iVar2 = rnd((int)urace.hpadv.lornd);
        local_10 = iVar2 + local_10;
      }
    }
    else {
      local_10 = (int)urole.hpadv.hifix + (int)urace.hpadv.hifix;
      if ('\0' < urole.hpadv.hirnd) {
        iVar2 = rnd((int)urole.hpadv.hirnd);
        local_10 = iVar2 + local_10;
      }
      if ('\0' < urace.hpadv.hirnd) {
        iVar2 = rnd((int)urace.hpadv.hirnd);
        local_10 = iVar2 + local_10;
      }
    }
    sVar1 = acurr(4);
    if (sVar1 < '\x04') {
      local_14 = -2;
    }
    else {
      sVar1 = acurr(4);
      if (sVar1 < '\a') {
        local_14 = -1;
      }
      else {
        sVar1 = acurr(4);
        if (sVar1 < '\x0f') {
          local_14 = 0;
        }
        else {
          sVar1 = acurr(4);
          if (sVar1 < '\x11') {
            local_14 = 1;
          }
          else {
            sVar1 = acurr(4);
            if (sVar1 == '\x11') {
              local_14 = 2;
            }
            else {
              sVar1 = acurr(4);
              if (sVar1 == '\x12') {
                local_14 = 3;
              }
              else {
                local_14 = 4;
              }
            }
          }
        }
      }
    }
    local_18 = local_14 + local_10;
    if (local_18 < 1) {
      local_18 = 1;
    }
    conplus = local_18;
  }
  return conplus;
}

Assistant:

int newhp(void)
{
	int	hp, conplus;


	if (u.ulevel == 0) {
	    /* Initialize hit points */
	    hp = urole.hpadv.infix + urace.hpadv.infix;
	    if (urole.hpadv.inrnd > 0) hp += rnd(urole.hpadv.inrnd);
	    if (urace.hpadv.inrnd > 0) hp += rnd(urace.hpadv.inrnd);

	    /* Initialize alignment stuff */
	    u.ualign.type = aligns[u.initalign].value;
	    u.ualign.record = urole.initrecord;

		return hp;
	} else {
	    if (u.ulevel < urole.xlev) {
	    	hp = urole.hpadv.lofix + urace.hpadv.lofix;
	    	if (urole.hpadv.lornd > 0) hp += rnd(urole.hpadv.lornd);
	    	if (urace.hpadv.lornd > 0) hp += rnd(urace.hpadv.lornd);
	    } else {
	    	hp = urole.hpadv.hifix + urace.hpadv.hifix;
	    	if (urole.hpadv.hirnd > 0) hp += rnd(urole.hpadv.hirnd);
	    	if (urace.hpadv.hirnd > 0) hp += rnd(urace.hpadv.hirnd);
	    }
	}

	if (ACURR(A_CON) <= 3) conplus = -2;
	else if (ACURR(A_CON) <= 6) conplus = -1;
	else if (ACURR(A_CON) <= 14) conplus = 0;
	else if (ACURR(A_CON) <= 16) conplus = 1;
	else if (ACURR(A_CON) == 17) conplus = 2;
	else if (ACURR(A_CON) == 18) conplus = 3;
	else conplus = 4;
	
	hp += conplus;
	return (hp <= 0) ? 1 : hp;
}